

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_util_load_mmaped_file(char *zFile,void **ppMap,unqlite_int64 *pFileSize)

{
  jx9_vfs *pjVar1;
  int local_34;
  int rc;
  jx9_vfs *pVfs;
  unqlite_int64 *pFileSize_local;
  void **ppMap_local;
  char *zFile_local;
  
  if ((((zFile == (char *)0x0) || (*zFile == '\0')) || (ppMap == (void **)0x0)) ||
     (pFileSize == (unqlite_int64 *)0x0)) {
    zFile_local._4_4_ = -0x18;
  }
  else {
    *ppMap = (void *)0x0;
    pjVar1 = jx9ExportBuiltinVfs();
    if ((pjVar1 == (jx9_vfs *)0x0) ||
       (pjVar1->xMmap == (_func_int_char_ptr_void_ptr_ptr_jx9_int64_ptr *)0x0)) {
      local_34 = -0x11;
    }
    else {
      local_34 = (*pjVar1->xMmap)(zFile,ppMap,pFileSize);
    }
    zFile_local._4_4_ = local_34;
  }
  return zFile_local._4_4_;
}

Assistant:

UNQLITE_APIEXPORT int unqlite_util_load_mmaped_file(const char *zFile,void **ppMap,unqlite_int64 *pFileSize)
{
	const jx9_vfs *pVfs;
	int rc;
	if( SX_EMPTY_STR(zFile) || ppMap == 0 || pFileSize == 0){
		/* Sanity check */
		return UNQLITE_CORRUPT;
	}
	*ppMap = 0;
	/* Extract the Jx9 Vfs */
	pVfs = jx9ExportBuiltinVfs();
	/*
	 * Check if the underlying vfs implement the memory map routines
	 * [i.e: mmap() under UNIX/MapViewOfFile() under windows].
	 */
	if( pVfs == 0 || pVfs->xMmap == 0 ){
		rc = UNQLITE_NOTIMPLEMENTED;
	 }else{ 
		 /* Try to get a read-only memory view of the whole file */
		 rc = pVfs->xMmap(zFile,ppMap,pFileSize);
	 }
	return rc;
}